

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O2

void cfl_luma_subsampling_422_hbd_ssse3
               (uint16_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  
  pauVar1 = (undefined1 (*) [16])(pred_buf_q3 + (ulong)(uint)(height << 2) * 8);
  do {
    if (width == 4) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)*(undefined1 (*) [16])input;
      auVar2 = phaddw(auVar2,auVar2);
      auVar2 = psllw(auVar2,2);
      *(int *)*(undefined1 (*) [16])pred_buf_q3 = auVar2._0_4_;
    }
    else {
      auVar2 = *(undefined1 (*) [16])input;
      if (width == 8) {
        auVar2 = phaddw(auVar2,auVar2);
        auVar2 = psllw(auVar2,2);
        *(long *)*(undefined1 (*) [16])pred_buf_q3 = auVar2._0_8_;
      }
      else {
        auVar2 = phaddw(auVar2,*(undefined1 (*) [16])((long)input + 0x10));
        auVar2 = psllw(auVar2,2);
        *(undefined1 (*) [16])pred_buf_q3 = auVar2;
        if (width == 0x20) {
          auVar2 = phaddw(*(undefined1 (*) [16])((long)input + 0x20),
                          *(undefined1 (*) [16])((long)input + 0x30));
          auVar2 = psllw(auVar2,2);
          *(undefined1 (*) [16])((long)pred_buf_q3 + 0x10) = auVar2;
        }
      }
    }
    pred_buf_q3 = (uint16_t *)((long)pred_buf_q3 + 0x40);
    input = (uint16_t *)(*(undefined1 (*) [16])input + (long)input_stride * 2);
  } while (pred_buf_q3 < pauVar1);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_422_hbd_ssse3(const uint16_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  __m128i *pred_buf_m128i = (__m128i *)pred_buf_q3;
  const __m128i *end = pred_buf_m128i + height * CFL_BUF_LINE_I128;
  do {
    if (width == 4) {
      const __m128i top = _mm_loadl_epi64((__m128i *)input);
      const __m128i sum = _mm_slli_epi16(_mm_hadd_epi16(top, top), 2);
      _mm_storeh_epi32(pred_buf_m128i, sum);
    } else {
      const __m128i top = _mm_loadu_si128((__m128i *)input);
      if (width == 8) {
        const __m128i sum = _mm_slli_epi16(_mm_hadd_epi16(top, top), 2);
        _mm_storel_epi64(pred_buf_m128i, sum);
      } else {
        const __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        const __m128i sum = _mm_slli_epi16(_mm_hadd_epi16(top, top_1), 2);
        _mm_storeu_si128(pred_buf_m128i, sum);
        if (width == 32) {
          const __m128i top_2 = _mm_loadu_si128(((__m128i *)input) + 2);
          const __m128i top_3 = _mm_loadu_si128(((__m128i *)input) + 3);
          const __m128i sum_1 = _mm_slli_epi16(_mm_hadd_epi16(top_2, top_3), 2);
          _mm_storeu_si128(pred_buf_m128i + 1, sum_1);
        }
      }
    }
    pred_buf_m128i += CFL_BUF_LINE_I128;
    input += input_stride;
  } while (pred_buf_m128i < end);
}